

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  char *text_begin;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_8;
  
  fVar3 = half_sz.x;
  fVar4 = half_sz.y;
  fVar1 = pos.x;
  fVar2 = pos.y;
  switch(direction) {
  case 0:
    local_8.y = fVar2 - fVar4;
    local_8.x = fVar1 + fVar3;
    text_begin = "<";
    break;
  case 1:
    local_8.y = fVar2 - fVar4;
    local_8.x = fVar1 + fVar3;
    text_begin = ">";
    break;
  case 2:
    local_8.y = fVar2 - fVar4;
    local_8.x = fVar1 + fVar3;
    text_begin = "^";
    break;
  case 3:
    local_8.y = fVar2 - fVar4;
    local_8.x = fVar1 + fVar3;
    text_begin = "v";
    break;
  default:
    goto switchD_00139364_default;
  }
  ImDrawList::AddText(draw_list,(ImFont *)0x0,0.0,&local_8,col,text_begin,(char *)0x0,0.0,
                      (ImVec4 *)0x0);
switchD_00139364_default:
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    //case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    //case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    //case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    //case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Left:  draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "<"); return;
    case ImGuiDir_Right: draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, ">"); return;
    case ImGuiDir_Up:    draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "^"); return;
    case ImGuiDir_Down:  draw_list->AddText(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), col, "v"); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}